

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O2

void test36(char *infile,char *password,char *outfile,char *xarg)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  iVar2 = qpdf_read(qpdf,infile,password);
  if (iVar2 != 0) {
    __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x44f,"void test36(const char *, const char *, const char *, const char *)");
  }
  uVar3 = qpdf_get_object_by_id(qpdf,3,0);
  iVar2 = qpdf_oh_is_dictionary(qpdf,uVar3);
  if (iVar2 == 0) {
    __assert_fail("qpdf_oh_is_dictionary(qpdf, page0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x453,"void test36(const char *, const char *, const char *, const char *)");
  }
  uVar4 = qpdf_oh_get_key(qpdf,uVar3,"/Rotate");
  lVar1 = qpdf_oh_get_int_value(qpdf,uVar4);
  if (lVar1 != 0x5a) {
    __assert_fail("qpdf_oh_get_int_value(qpdf, r) == 90",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x455,"void test36(const char *, const char *, const char *, const char *)");
  }
  qpdf_oh_remove_key(qpdf,uVar3,"/Rotate");
  iVar2 = qpdf_oh_has_key(qpdf,uVar3,"/Rotate");
  if (iVar2 == 0) {
    iVar2 = qpdf_push_inherited_attributes_to_page(qpdf);
    if (iVar2 != 0) {
      __assert_fail("qpdf_push_inherited_attributes_to_page(qpdf) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x459,"void test36(const char *, const char *, const char *, const char *)");
    }
    uVar4 = qpdf_oh_get_key(qpdf,uVar3,"/Rotate");
    lVar1 = qpdf_oh_get_int_value(qpdf,uVar4);
    if (lVar1 == 0x10e) {
      iVar2 = qpdf_add_page(qpdf,qpdf,uVar3,1);
      if (iVar2 == 0) {
        return;
      }
      __assert_fail("qpdf_add_page(qpdf, qpdf, page0, QPDF_TRUE) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x45d,"void test36(const char *, const char *, const char *, const char *)");
    }
    __assert_fail("qpdf_oh_get_int_value(qpdf, r) == 270",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x45b,"void test36(const char *, const char *, const char *, const char *)");
  }
  __assert_fail("!qpdf_oh_has_key(qpdf, page0, \"/Rotate\")",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                0x457,"void test36(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test36(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* This test uses inherited-rotate.pdf */

    assert(qpdf_read(qpdf, infile, password) == 0);

    /* Non-trivially push inherited attributes */
    qpdf_oh page0 = qpdf_get_object_by_id(qpdf, 3, 0);
    assert(qpdf_oh_is_dictionary(qpdf, page0));
    qpdf_oh r = qpdf_oh_get_key(qpdf, page0, "/Rotate");
    assert(qpdf_oh_get_int_value(qpdf, r) == 90);
    qpdf_oh_remove_key(qpdf, page0, "/Rotate");
    assert(!qpdf_oh_has_key(qpdf, page0, "/Rotate"));

    assert(qpdf_push_inherited_attributes_to_page(qpdf) == 0);
    r = qpdf_oh_get_key(qpdf, page0, "/Rotate");
    assert(qpdf_oh_get_int_value(qpdf, r) == 270);

    assert(qpdf_add_page(qpdf, qpdf, page0, QPDF_TRUE) == 0);
}